

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svrg.cc
# Opt level: O3

void SVRG::update_inner(svrg *s,example *ec)

{
  loss_function *plVar1;
  vw *pvVar2;
  float extraout_XMM0_Da;
  float fVar3;
  float extraout_XMM0_Da_00;
  update u;
  update local_20;
  
  plVar1 = s->all->loss;
  (*plVar1->_vptr_loss_function[6])((ec->pred).scalar,(ec->l).simple.label,plVar1,s->all->sd);
  local_20.g_scalar_inner = extraout_XMM0_Da * ec->weight;
  fVar3 = predict_stable(s,ec);
  plVar1 = s->all->loss;
  (*plVar1->_vptr_loss_function[6])(fVar3,(ec->l).simple.label,plVar1,s->all->sd);
  local_20.g_scalar_stable = extraout_XMM0_Da_00 * ec->weight;
  pvVar2 = s->all;
  local_20.eta = pvVar2->eta;
  local_20.norm = (float)s->stable_grad_count;
  if ((pvVar2->weights).sparse == true) {
    GD::foreach_feature<SVRG::update,_float_&,_&SVRG::update_inner_feature,_sparse_parameters>
              (&(pvVar2->weights).sparse_weights,pvVar2->ignore_some_linear,pvVar2->ignore_linear,
               &pvVar2->interactions,pvVar2->permutations,&ec->super_example_predict,&local_20);
  }
  else {
    GD::foreach_feature<SVRG::update,_float_&,_&SVRG::update_inner_feature,_dense_parameters>
              (&(pvVar2->weights).dense_weights,pvVar2->ignore_some_linear,pvVar2->ignore_linear,
               &pvVar2->interactions,pvVar2->permutations,&ec->super_example_predict,&local_20);
  }
  return;
}

Assistant:

void update_inner(const svrg& s, example& ec)
{
  update u;
  // |ec| already has prediction according to inner weights.
  u.g_scalar_inner = gradient_scalar(s, ec, ec.pred.scalar);
  u.g_scalar_stable = gradient_scalar(s, ec, predict_stable(s, ec));
  u.eta = s.all->eta;
  u.norm = (float)s.stable_grad_count;
  GD::foreach_feature<update, update_inner_feature>(*s.all, ec, u);
}